

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# guess_basis.cc
# Opt level: O3

vector<int,_std::allocator<int>_> *
ipx::GuessBasis(vector<int,_std::allocator<int>_> *__return_storage_ptr__,Control *control,
               Model *model,double *colweights)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  pointer pdVar7;
  iterator iVar8;
  pointer piVar9;
  pointer piVar10;
  int *__first;
  Int *pIVar11;
  vector<int,std::allocator<int>> *this;
  pointer marked_00;
  pointer piVar12;
  double dVar13;
  bool bVar14;
  Int top;
  uint uVar15;
  int iVar16;
  void *__s;
  ulong uVar17;
  ostream *poVar18;
  pointer piVar19;
  int iVar20;
  size_type sVar21;
  long lVar22;
  size_type __n;
  pointer piVar23;
  long lVar24;
  int iVar25;
  long lVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  int local_210;
  char local_209;
  vector<int,std::allocator<int>> *local_208;
  string local_200;
  int local_1dc;
  Int *local_1d8;
  double *local_1d0;
  Int *local_1c8;
  undefined8 uStack_1c0;
  Control *local_1b0;
  vector<int,_std::allocator<int>_> work;
  vector<int,_std::allocator<int>_> pattern;
  SparseMatrix L;
  vector<int,_std::allocator<int>_> marked;
  vector<int,_std::allocator<int>_> rownumber;
  vector<int,_std::allocator<int>_> active;
  vector<int,_std::allocator<int>_> cheap;
  vector<int,_std::allocator<int>_> work3;
  vector<int,_std::allocator<int>_> work2;
  vector<int,_std::allocator<int>_> work_1;
  
  iVar1 = model->num_rows_;
  iVar2 = model->num_cols_;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  L.nrow_ = -1;
  local_208 = (vector<int,std::allocator<int>> *)__return_storage_ptr__;
  local_1d0 = colweights;
  local_1b0 = control;
  std::vector<int,_std::allocator<int>_>::vector
            (&rownumber,(long)iVar1,&L.nrow_,(allocator_type *)&local_200);
  L.nrow_ = 1;
  std::vector<int,_std::allocator<int>_>::vector
            (&active,(long)(iVar1 + iVar2),&L.nrow_,(allocator_type *)&local_200);
  piVar12 = active.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start;
  local_1d8 = rownumber.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
  iVar3 = model->num_rows_;
  sVar21 = (size_type)iVar3;
  iVar20 = model->num_cols_;
  std::vector<int,_std::allocator<int>_>::vector(&pattern,sVar21,(allocator_type *)&L);
  std::vector<int,_std::allocator<int>_>::vector(&work,sVar21,(allocator_type *)&L);
  L.nrow_ = -1;
  std::vector<int,_std::allocator<int>_>::vector
            (&marked,sVar21,&L.nrow_,(allocator_type *)&local_200);
  __s = operator_new(sVar21 * 8);
  local_210 = 0;
  memset(__s,0,sVar21 * 8);
  SparseMatrix::SparseMatrix(&L,iVar3,0);
  local_200._M_dataplus._M_p._0_4_ = 0;
  iVar25 = iVar20 + iVar3;
  if (iVar25 != 0 && SCARRY4(iVar20,iVar3) == iVar25 < 0) {
    local_210 = 0;
    local_1dc = iVar25;
    do {
      marked_00 = marked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
      piVar10 = L.rowidx_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      piVar9 = pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
               ._M_start;
      piVar23 = work.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start;
      uVar15 = (uint)local_200._M_dataplus._M_p;
      lVar26 = (long)(int)(uint)local_200._M_dataplus._M_p;
      if (INFINITY <= local_1d0[lVar26]) {
        local_1c8 = L.colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
        piVar19 = (model->AI_).colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        lVar22 = (long)piVar19[lVar26];
        top = L.nrow_;
        if (piVar19[lVar26] < piVar19[lVar26 + 1]) {
          do {
            iVar3 = (model->AI_).rowidx_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar22];
            if (marked_00[iVar3] != uVar15) {
              top = DepthFirstSearch(iVar3,local_1c8,piVar10,local_1d8,top,piVar9,marked_00,uVar15,
                                     piVar23);
              piVar19 = (model->AI_).colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start;
            }
            lVar22 = lVar22 + 1;
          } while (lVar22 < piVar19[lVar26 + 1]);
          if (L.nrow_ <= top) goto LAB_00397294;
          lVar26 = (long)top;
          do {
            *(undefined8 *)
             ((long)__s +
             (long)pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar26] * 8) = 0;
            lVar26 = lVar26 + 1;
          } while (L.nrow_ != lVar26);
          bVar14 = true;
        }
        else {
LAB_00397294:
          bVar14 = false;
        }
        pIVar11 = local_1d8;
        iVar25 = local_1dc;
        lVar26 = (long)(int)(uint)local_200._M_dataplus._M_p;
        lVar22 = (long)piVar19[lVar26];
        iVar3 = piVar19[lVar26 + 1];
        if (piVar19[lVar26] < iVar3) {
          piVar23 = (model->AI_).rowidx_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pdVar7 = (model->AI_).values_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          do {
            *(double *)((long)__s + (long)piVar23[lVar22] * 8) = pdVar7[lVar22];
            lVar22 = lVar22 + 1;
          } while (iVar3 != lVar22);
        }
        if (bVar14) {
          lVar22 = (long)top;
          uVar15 = 0xffffffff;
          dVar27 = 0.0;
          do {
            uVar4 = pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar22];
            dVar28 = *(double *)((long)__s + (long)(int)uVar4 * 8);
            if ((dVar28 != 0.0) || (NAN(dVar28))) {
              uVar5 = local_1d8[(int)uVar4];
              if ((int)uVar5 < 0) {
                if (dVar27 < ABS(dVar28)) {
                  dVar27 = ABS(dVar28);
                  uVar15 = uVar4;
                }
              }
              else {
                lVar24 = (long)L.colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[uVar5];
                iVar3 = L.colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[(ulong)uVar5 + 1];
                if (L.colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar5] < iVar3) {
                  do {
                    *(double *)
                     ((long)__s +
                     (long)L.rowidx_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar24] * 8) =
                         *(double *)
                          ((long)__s +
                          (long)L.rowidx_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start[lVar24] * 8) -
                         L.values_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar24] * dVar28;
                    lVar24 = lVar24 + 1;
                  } while (iVar3 != lVar24);
                }
              }
            }
            lVar22 = lVar22 + 1;
          } while (lVar22 != L.nrow_);
          if ((int)uVar15 < 0) {
            local_1c8 = (Int *)0x0;
          }
          else {
            local_1c8 = *(Int **)((long)__s + (ulong)uVar15 * 8);
          }
        }
        else {
          local_1c8 = (Int *)0x0;
          uVar15 = 0xffffffff;
        }
        uStack_1c0 = 0;
        if (0.001 < ABS((double)local_1c8)) {
          iVar8._M_current = *(int **)(local_208 + 8);
          local_1d8[(int)uVar15] = (Int)((ulong)((long)iVar8._M_current - *(long *)local_208) >> 2);
          if (iVar8._M_current == *(int **)(local_208 + 0x10)) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      (local_208,iVar8,(int *)&local_200);
            piVar19 = (model->AI_).colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
          }
          else {
            *iVar8._M_current = (uint)local_200._M_dataplus._M_p;
            *(int **)(local_208 + 8) = iVar8._M_current + 1;
          }
          uVar17 = (ulong)(int)(uint)local_200._M_dataplus._M_p;
          lVar26 = (long)piVar19[uVar17];
          if (piVar19[uVar17] < piVar19[uVar17 + 1]) {
            do {
              iVar3 = (model->AI_).rowidx_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar26];
              if (pIVar11[iVar3] < 0) {
                dVar27 = *(double *)((long)__s + (long)iVar3 * 8);
                if ((dVar27 != 0.0) || (NAN(dVar27))) {
                  SparseMatrix::push_back(&L,iVar3,dVar27 / (double)local_1c8);
                  uVar17 = (ulong)(uint)local_200._M_dataplus._M_p;
                  piVar19 = (model->AI_).colptr_.super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl.super__Vector_impl_data._M_start;
                }
              }
              lVar26 = lVar26 + 1;
            } while (lVar26 < piVar19[(long)(int)uVar17 + 1]);
          }
          SparseMatrix::add_column(&L);
          local_210 = local_210 + 1;
          lVar26 = (long)(int)(uint)local_200._M_dataplus._M_p;
        }
        piVar12[lVar26] = 0;
      }
      local_200._M_dataplus._M_p._0_4_ = (uint)local_200._M_dataplus._M_p + 1;
    } while ((int)(uint)local_200._M_dataplus._M_p < iVar25);
  }
  poVar18 = Control::Debug(local_1b0,1);
  Textline<char[44]>(&local_200,(char (*) [44])"Number of free variables in starting basis:");
  poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar18,(char *)CONCAT44(local_200._M_dataplus._M_p._4_4_,
                                                (uint)local_200._M_dataplus._M_p),
                       local_200._M_string_length);
  poVar18 = (ostream *)std::ostream::operator<<(poVar18,local_210);
  cheap.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start._0_1_
       = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar18,(char *)&cheap,1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_200._M_dataplus._M_p._4_4_,(uint)local_200._M_dataplus._M_p) !=
      &local_200.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_200._M_dataplus._M_p._4_4_,(uint)local_200._M_dataplus._M_p));
  }
  if (L.values_queue_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(L.values_queue_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (L.rowidx_queue_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(L.rowidx_queue_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (L.values_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(L.values_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (L.rowidx_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(L.rowidx_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (L.colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(L.colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  operator_delete(__s);
  if (marked.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      != (pointer)0x0) {
    operator_delete(marked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (work.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start !=
      (pointer)0x0) {
    operator_delete(work.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      != (pointer)0x0) {
    operator_delete(pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  piVar23 = active.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start;
  piVar12 = rownumber.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start;
  iVar3 = model->num_rows_;
  if ((long)iVar3 < 1) {
    iVar20 = 0;
  }
  else {
    lVar26 = 0;
    iVar20 = 0;
    do {
      if (piVar12[lVar26] < 0) {
        L.nrow_ = -1;
        piVar9 = (model->AIt_).colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar22 = (long)piVar9[lVar26];
        iVar25 = piVar9[lVar26 + 1];
        if (piVar9[lVar26] < iVar25) {
          piVar10 = (model->AI_).colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          dVar27 = 0.0;
          iVar16 = -1;
          dVar28 = 0.0;
          do {
            iVar6 = (model->AIt_).rowidx_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar22];
            if (piVar23[iVar6] != 0) {
              dVar29 = ABS((model->AIt_).values_.super__Vector_base<double,_std::allocator<double>_>
                           ._M_impl.super__Vector_impl_data._M_start[lVar22]) * local_1d0[iVar6];
              dVar13 = dVar29;
              if (dVar29 <= dVar28) {
                dVar13 = dVar28;
              }
              dVar28 = dVar13;
              if ((dVar27 < dVar29) && (piVar10[(long)iVar6 + 1] == piVar10[iVar6] + 1)) {
                iVar25 = piVar9[lVar26 + 1];
                dVar27 = dVar29;
                iVar16 = iVar6;
                L.nrow_ = iVar6;
              }
            }
            lVar22 = lVar22 + 1;
          } while (lVar22 < iVar25);
          if ((0.0 < dVar27) && (dVar28 * 0.5 <= dVar27)) {
            iVar8._M_current = *(int **)(local_208 + 8);
            piVar12[lVar26] = (int)((ulong)((long)iVar8._M_current - *(long *)local_208) >> 2);
            if (iVar8._M_current == *(int **)(local_208 + 0x10)) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        (local_208,iVar8,&L.nrow_);
            }
            else {
              *iVar8._M_current = iVar16;
              *(int **)(local_208 + 8) = iVar8._M_current + 1;
            }
            piVar23[L.nrow_] = 0;
            iVar20 = iVar20 + 1;
          }
        }
      }
      lVar26 = lVar26 + 1;
    } while (lVar26 != iVar3);
  }
  poVar18 = Control::Debug(local_1b0,1);
  Textline<char[40]>((string *)&L,(char (*) [40])"Number of singletons in starting basis:");
  poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar18,(char *)CONCAT44(L._4_4_,L.nrow_),
                       (long)L.colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start);
  poVar18 = (ostream *)std::ostream::operator<<(poVar18,iVar20);
  local_200._M_dataplus._M_p._0_4_ = CONCAT31(local_200._M_dataplus._M_p._1_3_,10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar18,(char *)&local_200,1);
  if ((pointer *)CONCAT44(L._4_4_,L.nrow_) !=
      &L.colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish) {
    operator_delete((undefined1 *)CONCAT44(L._4_4_,L.nrow_));
  }
  piVar12 = rownumber.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start;
  local_1c8 = active.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start;
  uVar15 = model->num_rows_;
  __n = (size_type)(int)uVar15;
  iVar3 = model->num_cols_;
  sVar21 = (long)iVar3 + __n;
  Sortperm(&pattern,(Int)sVar21,local_1d0,true);
  L.nrow_ = -1;
  std::vector<int,_std::allocator<int>_>::vector(&work,__n,&L.nrow_,(allocator_type *)&local_200);
  if (0 < (int)uVar15) {
    uVar17 = 0;
    do {
      if (-1 < piVar12[uVar17]) {
        work.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
        [uVar17] = -2;
      }
      uVar17 = uVar17 + 1;
    } while (uVar15 != uVar17);
  }
  L.nrow_ = -1;
  std::vector<int,_std::allocator<int>_>::vector
            (&marked,sVar21,&L.nrow_,(allocator_type *)&local_200);
  __first = (model->AI_).colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  pIVar11 = (model->AI_).rowidx_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  std::vector<int,std::allocator<int>>::vector<int_const*,void>
            ((vector<int,std::allocator<int>> *)&cheap,__first,__first + (long)iVar3 + __n,
             (allocator_type *)&L);
  std::vector<int,_std::allocator<int>_>::vector(&work_1,__n,(allocator_type *)&L);
  std::vector<int,_std::allocator<int>_>::vector(&work2,__n + 1,(allocator_type *)&L);
  std::vector<int,_std::allocator<int>_>::vector(&work3,__n + 1,(allocator_type *)&L);
  if (pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      == pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish) {
    iVar3 = 0;
    iVar20 = 0;
  }
  else {
    iVar20 = 0;
    iVar3 = 0;
    piVar23 = pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start;
    do {
      L.nrow_ = *piVar23;
      if (local_1c8[L.nrow_] != 0) {
        if ((local_1d0[L.nrow_] == 0.0) && (!NAN(local_1d0[L.nrow_]))) break;
        bVar14 = AugmentingPath(L.nrow_,__first,pIVar11,
                                work.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start,
                                (Int *)CONCAT71(cheap.super__Vector_base<int,_std::allocator<int>_>.
                                                _M_impl.super__Vector_impl_data._M_start._1_7_,
                                                cheap.super__Vector_base<int,_std::allocator<int>_>.
                                                _M_impl.super__Vector_impl_data._M_start._0_1_),
                                marked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start,
                                work_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start,
                                work2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start,
                                work3.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        if (bVar14) {
          iVar8._M_current = *(int **)(local_208 + 8);
          if (iVar8._M_current == *(int **)(local_208 + 0x10)) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      (local_208,iVar8,&L.nrow_);
          }
          else {
            *iVar8._M_current = L.nrow_;
            *(int **)(local_208 + 8) = iVar8._M_current + 1;
          }
          iVar3 = iVar3 + 1;
        }
        else {
          iVar20 = iVar20 + 1;
        }
        if ((int)((uVar15 - (int)((ulong)((long)*(pointer *)(local_208 + 8) - *(long *)local_208) >>
                                 2)) * 10) <= iVar20) break;
      }
      piVar23 = piVar23 + 1;
    } while (piVar23 !=
             pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish);
  }
  if (0 < (int)uVar15) {
    uVar17 = 0;
    do {
      if (-1 < work.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start[uVar17]) {
        piVar12[uVar17] = uVar15;
      }
      uVar17 = uVar17 + 1;
    } while (uVar15 != uVar17);
  }
  poVar18 = Control::Debug(local_1b0,1);
  this = local_208;
  Textline<char[33]>((string *)&L,(char (*) [33])"Number of other columns matched:");
  poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar18,(char *)CONCAT44(L._4_4_,L.nrow_),
                       (long)L.colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start);
  poVar18 = (ostream *)std::ostream::operator<<(poVar18,iVar3);
  local_200._M_dataplus._M_p._0_4_ = CONCAT31(local_200._M_dataplus._M_p._1_3_,10);
  poVar18 = std::__ostream_insert<char,std::char_traits<char>>(poVar18,(char *)&local_200,1);
  Textline<char[32]>(&local_200,(char (*) [32])"Number of other columns failed:");
  poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar18,(char *)CONCAT44(local_200._M_dataplus._M_p._4_4_,
                                                (uint)local_200._M_dataplus._M_p),
                       local_200._M_string_length);
  poVar18 = (ostream *)std::ostream::operator<<(poVar18,iVar20);
  local_209 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar18,&local_209,1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_200._M_dataplus._M_p._4_4_,(uint)local_200._M_dataplus._M_p) !=
      &local_200.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_200._M_dataplus._M_p._4_4_,(uint)local_200._M_dataplus._M_p));
  }
  if ((pointer *)CONCAT44(L._4_4_,L.nrow_) !=
      &L.colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish) {
    operator_delete((undefined1 *)CONCAT44(L._4_4_,L.nrow_));
  }
  if (work3.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      != (pointer)0x0) {
    operator_delete(work3.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (work2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      != (pointer)0x0) {
    operator_delete(work2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (work_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      != (pointer)0x0) {
    operator_delete(work_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((void *)CONCAT71(cheap.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start._1_7_,
                       cheap.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start._0_1_) != (void *)0x0) {
    operator_delete((void *)CONCAT71(cheap.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._1_7_,
                                     cheap.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._0_1_));
  }
  if (marked.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      != (pointer)0x0) {
    operator_delete(marked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (work.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start !=
      (pointer)0x0) {
    operator_delete(work.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      != (pointer)0x0) {
    operator_delete(pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (0 < iVar1) {
    sVar21 = 0;
    do {
      if (rownumber.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[sVar21] < 0) {
        L.nrow_ = (int)sVar21 + iVar2;
        iVar8._M_current = *(int **)(this + 8);
        if (iVar8._M_current == *(int **)(this + 0x10)) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    ((vector<int,_std::allocator<int>_> *)this,iVar8,&L.nrow_);
        }
        else {
          *iVar8._M_current = L.nrow_;
          *(int **)(this + 8) = iVar8._M_current + 1;
        }
      }
      sVar21 = sVar21 + 1;
    } while ((long)iVar1 != sVar21);
  }
  if (active.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      != (pointer)0x0) {
    operator_delete(active.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (rownumber.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(rownumber.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return (vector<int,_std::allocator<int>_> *)this;
}

Assistant:

std::vector<Int> GuessBasis(const Control& control, const Model& model,
                            const double* colweights) {
    const Int m = model.rows();
    const Int n = model.cols();

    // basis starts empty and is filled one index at a time. rownumber[i] >= 0
    // iff row i was pivot row when a column was added to the basis. (The
    // specific value has a different meaning in each method.) A column is
    // "active" if it is eligible for being added to the basis.
    std::vector<Int> basis, rownumber(m, -1);
    std::vector<int> active(n+m, 1);

    ProcessFreeColumns(control, model, colweights, &basis, rownumber.data(),
                       active.data());
    ProcessSingletons(control, model, colweights, &basis, rownumber.data(),
                      active.data());
    ProcessRemaining(control, model, colweights, &basis, rownumber.data(),
                     active.data());

    // Complete basis with unit columns.
    for (Int i = 0; i < m; i++) {
        if (rownumber[i] < 0)
            basis.push_back(n+i);
    }
    assert((Int)basis.size() == m);
    return basis;
}